

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O0

SPxId __thiscall soplex::SPxParMultPR<double>::selectEnter(SPxParMultPR<double> *this)

{
  bool bVar1;
  Pricing PVar2;
  int iVar3;
  SPxParMultPr_Tmp *pSVar4;
  double *pdVar5;
  SPxParMultPr_Tmp *pSVar6;
  DataKey DVar7;
  double dVar8;
  long in_RDI;
  SPxSolverBase<double> *pSVar9;
  double bestx;
  int n;
  double tol;
  double val;
  int lastlast;
  int best;
  int i;
  double x;
  SPxId id;
  double in_stack_ffffffffffffff38;
  int iVar10;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint i_00;
  SPxSolverBase<double> *in_stack_ffffffffffffff48;
  SPxSolverBase<double> *in_stack_ffffffffffffff50;
  SPxSolverBase<double> *in_stack_ffffffffffffff58;
  double local_58;
  double local_30;
  int local_1c;
  DataKey local_8;
  
  SPxId::SPxId((SPxId *)0x2e90b9);
  PVar2 = SPxSolverBase<double>::pricing(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  if (PVar2 == PARTIAL) {
    dVar8 = -*(double *)(in_RDI + 0x18);
    iVar10 = *(int *)(in_RDI + 0x5c);
    local_1c = *(int *)(in_RDI + 0x54);
    while (local_1c = local_1c + -1, -1 < local_1c) {
      Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      SPxLPBase<double>::number
                (&in_stack_ffffffffffffff50->super_SPxLPBase<double>,
                 (SPxId *)in_stack_ffffffffffffff48);
      pSVar9 = *(SPxSolverBase<double> **)(in_RDI + 0x10);
      pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                         ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      bVar1 = SPxSolverBase<double>::isId(pSVar9,&pSVar4->id);
      if (bVar1) {
        SPxSolverBase<double>::computePvec
                  (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_30 = SPxSolverBase<double>::computeTest
                             (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
        pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                           ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        pSVar4->test = local_30;
      }
      else {
        SPxSolverBase<double>::coTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        local_30 = *pdVar5;
        pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                           ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        pSVar4->test = local_30;
      }
      if (dVar8 <= local_30) {
        *(int *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) + -1;
        pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                           ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        pSVar6 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                           ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        (pSVar6->id).super_DataKey = (pSVar4->id).super_DataKey;
        pSVar6->test = pSVar4->test;
      }
    }
    while (iVar3 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::size
                             ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)0x2e92c6),
          iVar3 - *(int *)(in_RDI + 0x54) < *(int *)(in_RDI + 0x60)) {
      for (local_1c = 1; iVar3 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
          local_1c < *(int *)(in_RDI + 0x54); local_1c = local_1c + 1) {
        Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                  ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar3);
        Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                  ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      }
      *(int *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) + -1;
      in_stack_ffffffffffffff58 =
           (SPxSolverBase<double> *)
           Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                     ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar3);
      pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                         ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      (pSVar4->id).super_DataKey =
           (DataKey)(in_stack_ffffffffffffff58->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                    _vptr_ClassArray;
      pSVar4->test = *(double *)
                      &(in_stack_ffffffffffffff58->super_SPxLPBase<double>).
                       super_LPRowSetBase<double>.super_SVSetBase<double>.
                       super_ClassArray<soplex::Nonzero<double>_>.thesize;
    }
    do {
      *(int *)(in_RDI + 0x5c) = (*(int *)(in_RDI + 0x5c) + 1) % *(int *)(in_RDI + 0x50);
      iVar3 = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e93d1);
      i_00 = in_stack_ffffffffffffff44;
      for (local_1c = (iVar3 - *(int *)(in_RDI + 0x5c)) + -1; -1 < local_1c;
          local_1c = local_1c - *(int *)(in_RDI + 0x50)) {
        SPxSolverBase<double>::computePvec
                  (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        pSVar9 = (SPxSolverBase<double> *)
                 SPxSolverBase<double>::computeTest(in_stack_ffffffffffffff48,i_00);
        if ((double)pSVar9 < dVar8) {
          DVar7 = (DataKey)SPxSolverBase<double>::id
                                     (in_stack_ffffffffffffff58,
                                      (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
          pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                             ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                              CONCAT44(i_00,in_stack_ffffffffffffff40),
                              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          (pSVar4->id).super_DataKey = DVar7;
          pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                             ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                              CONCAT44(i_00,in_stack_ffffffffffffff40),
                              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          pSVar4->test = (double)pSVar9;
          *(int *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) + 1;
          in_stack_ffffffffffffff50 = pSVar9;
        }
      }
      iVar3 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e94ee);
      for (local_1c = (iVar3 - *(int *)(in_RDI + 0x5c)) + -1; -1 < local_1c;
          local_1c = local_1c - *(int *)(in_RDI + 0x50)) {
        SPxSolverBase<double>::coTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)CONCAT44(i_00,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        pSVar9 = (SPxSolverBase<double> *)*pdVar5;
        if ((double)pSVar9 < dVar8) {
          DVar7 = (DataKey)SPxSolverBase<double>::coId
                                     (in_stack_ffffffffffffff58,
                                      (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
          pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                             ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                              CONCAT44(i_00,in_stack_ffffffffffffff40),
                              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          (pSVar4->id).super_DataKey = DVar7;
          pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                             ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                              CONCAT44(i_00,in_stack_ffffffffffffff40),
                              (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          pSVar4->test = (double)pSVar9;
          *(int *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) + 1;
          in_stack_ffffffffffffff48 = pSVar9;
        }
      }
      in_stack_ffffffffffffff44 = i_00 & 0xffffff;
      if (*(int *)(in_RDI + 0x54) < *(int *)(in_RDI + 0x58)) {
        in_stack_ffffffffffffff44 = CONCAT13(*(int *)(in_RDI + 0x5c) != iVar10,(int3)i_00);
      }
    } while ((char)(in_stack_ffffffffffffff44 >> 0x18) != '\0');
    if (0 < *(int *)(in_RDI + 0x54)) {
      *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x54) + 1;
      if (*(int *)(in_RDI + 0x58) < 1) {
        *(undefined4 *)(in_RDI + 0x58) = 1;
      }
      if (*(int *)(in_RDI + 0x60) < *(int *)(in_RDI + 0x58)) {
        *(undefined4 *)(in_RDI + 0x58) = *(undefined4 *)(in_RDI + 0x60);
      }
      for (local_1c = 1; iVar10 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
          local_1c < *(int *)(in_RDI + 0x54); local_1c = local_1c + 1) {
        pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                           ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar10);
        in_stack_ffffffffffffff38 = pSVar4->test;
        Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                  ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      }
      pSVar4 = Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::operator[]
                         ((Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar10);
      local_8 = (pSVar4->id).super_DataKey;
    }
  }
  else {
    local_58 = -*(double *)(in_RDI + 0x18);
    local_1c = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2e974b);
    while (local_1c = local_1c + -1, -1 < local_1c) {
      SPxSolverBase<double>::coTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      if (*pdVar5 < local_58) {
        local_8 = (DataKey)SPxSolverBase<double>::coId
                                     (in_stack_ffffffffffffff58,
                                      (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        SPxSolverBase<double>::coTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        local_58 = *pdVar5;
      }
    }
    local_1c = SPxSolverBase<double>::coDim((SPxSolverBase<double> *)0x2e9819);
    while (local_1c = local_1c + -1, -1 < local_1c) {
      SPxSolverBase<double>::test(*(SPxSolverBase<double> **)(in_RDI + 0x10));
      pdVar5 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      if (*pdVar5 < local_58) {
        local_8 = (DataKey)SPxSolverBase<double>::id
                                     (in_stack_ffffffffffffff58,
                                      (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        SPxSolverBase<double>::test(*(SPxSolverBase<double> **)(in_RDI + 0x10));
        pdVar5 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        local_58 = *pdVar5;
      }
    }
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}